

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edition_unittest.pb.cc
# Opt level: O0

size_t __thiscall
edition_unittest::TestChildExtensionData::ByteSizeLong(TestChildExtensionData *this)

{
  uint uVar1;
  uint32_t *puVar2;
  size_t sVar3;
  string_view sVar4;
  string_view value;
  WireFormatLite *local_80;
  WireFormatLite *local_70;
  size_t sStack_58;
  uint32_t cached_has_bits;
  size_t total_size;
  TestChildExtensionData *this_;
  TestChildExtensionData *this_local;
  ulong local_38;
  size_t line;
  void *prefetch_ptr;
  ptrdiff_t offset;
  
  sStack_58 = 0;
  for (local_38 = 0; local_38 < 5; local_38 = local_38 + 1) {
  }
  puVar2 = google::protobuf::internal::HasBits<1>::operator[](&(this->field_0)._impl_._has_bits_,0);
  uVar1 = *puVar2;
  if ((uVar1 & 7) != 0) {
    if ((uVar1 & 1) != 0) {
      sVar4 = _internal_a(this);
      local_70 = (WireFormatLite *)sVar4._M_len;
      sVar4._M_len = (size_t)sVar4._M_str;
      sStack_58 = google::protobuf::internal::WireFormatLite::StringSize(local_70,sVar4);
      sStack_58 = sStack_58 + 1;
    }
    if ((uVar1 & 2) != 0) {
      sVar4 = _internal_b(this);
      value._M_str = sVar4._M_str;
      local_80 = (WireFormatLite *)sVar4._M_len;
      value._M_len = (size_t)value._M_str;
      sVar3 = google::protobuf::internal::WireFormatLite::StringSize(local_80,value);
      sStack_58 = sVar3 + 1 + sStack_58;
    }
    if ((uVar1 & 4) != 0) {
      sVar3 = google::protobuf::internal::WireFormatLite::
              MessageSize<edition_unittest::TestChildExtensionData_NestedTestAllExtensionsData>
                        ((this->field_0)._impl_.optional_extension_);
      sStack_58 = sVar3 + 1 + sStack_58;
    }
  }
  sVar3 = google::protobuf::Message::MaybeComputeUnknownFieldsSize
                    (&this->super_Message,sStack_58,&(this->field_0)._impl_._cached_size_);
  return sVar3;
}

Assistant:

::size_t TestChildExtensionData::ByteSizeLong() const {
  const TestChildExtensionData& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(message_byte_size_start:edition_unittest.TestChildExtensionData)
  ::size_t total_size = 0;

  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void)cached_has_bits;

  ::_pbi::Prefetch5LinesFrom7Lines(&this_);
  cached_has_bits = this_._impl_._has_bits_[0];
  if ((cached_has_bits & 0x00000007u) != 0) {
    // string a = 1;
    if ((cached_has_bits & 0x00000001u) != 0) {
      total_size += 1 + ::google::protobuf::internal::WireFormatLite::StringSize(
                                      this_._internal_a());
    }
    // string b = 2;
    if ((cached_has_bits & 0x00000002u) != 0) {
      total_size += 1 + ::google::protobuf::internal::WireFormatLite::StringSize(
                                      this_._internal_b());
    }
    // .edition_unittest.TestChildExtensionData.NestedTestAllExtensionsData optional_extension = 3;
    if ((cached_has_bits & 0x00000004u) != 0) {
      total_size += 1 +
                    ::google::protobuf::internal::WireFormatLite::MessageSize(*this_._impl_.optional_extension_);
    }
  }
  return this_.MaybeComputeUnknownFieldsSize(total_size,
                                             &this_._impl_._cached_size_);
}